

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  int iVar1;
  int y_parity;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1076db);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0x5a,"test condition failed: !secp256k1_ge_is_infinity(r)");
    abort();
  }
  iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x107734);
  if (iVar1 != 0) {
    secp256k1_fe_negate_unchecked
              ((secp256k1_fe *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,0
              );
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}